

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O2

exr_result_t
exr_attr_list_add_by_type
          (exr_context_t ctxt,exr_attribute_list_t *list,char *name,char *type,int32_t data_len,
          uint8_t **data_ptr,exr_attribute_t **attr)

{
  exr_attribute_t *peVar1;
  char *__s2;
  long lVar2;
  exr_result_t eVar3;
  int iVar4;
  exr_attribute_type_t eVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar9;
  exr_attribute_t *local_58;
  char *local_50;
  size_t local_48;
  exr_attribute_t **local_40;
  exr_attribute_list_t *local_38;
  
  local_58 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((type == (char *)0x0) || (*type == '\0')) {
    eVar3 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid type to add_by_type");
    return eVar3;
  }
  eVar3 = validate_attr_arguments((_internal_exr_context *)ctxt,list,name,data_len,data_ptr,attr);
  if (eVar3 == 0) {
    local_38 = list;
    uVar6 = strlen(name);
    uVar9 = (ulong)(byte)ctxt[2];
    if (uVar9 < uVar6) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x48);
      pcVar8 = "Provided name \'%s\' too long for file (len %d, max %d)";
LAB_0010d6b2:
      eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,0xc,pcVar8,name,uVar6 & 0xffffffff,uVar9);
      return eVar3;
    }
    local_50 = name;
    local_48 = uVar6;
    uVar6 = strlen(type);
    if (uVar9 < uVar6) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x48);
      pcVar8 = "Provided type name \'%s\' too long for file (len %d, max %d)";
      name = type;
      goto LAB_0010d6b2;
    }
    local_40 = attr;
    lVar2 = 0;
    do {
      lVar7 = lVar2;
      if (lVar7 + 0x18 == 0x2b8) {
        pcVar8 = (char *)(ulong)(uint)data_len;
        eVar3 = create_attr_block((_internal_exr_context *)ctxt,&local_58,0x38,data_len,data_ptr,
                                  local_50,(int32_t)local_48,type,(int32_t)uVar6);
        if (eVar3 != 0) goto LAB_0010d7b0;
        eVar5 = EXR_ATTR_OPAQUE;
        goto LAB_0010d793;
      }
      __s2 = *(char **)((long)&the_predefined_attr_typenames[0].name + lVar7);
      iVar4 = strcmp(type,__s2);
      lVar2 = lVar7 + 0x18;
    } while (iVar4 != 0);
    pcVar8 = (char *)(ulong)(uint)data_len;
    eVar3 = create_attr_block((_internal_exr_context *)ctxt,&local_58,
                              *(size_t *)((long)&the_predefined_attr_typenames[0].exp_size + lVar7),
                              data_len,data_ptr,local_50,(int32_t)local_48,(char *)0x0,0);
    if (eVar3 == 0) {
      local_58->type_name = __s2;
      local_58->type_name_length =
           *(uint8_t *)((long)&the_predefined_attr_typenames[0].name_len + lVar7);
      eVar5 = *(exr_attribute_type_t *)((long)&the_predefined_attr_typenames[0].type + lVar7);
LAB_0010d793:
      peVar1 = local_58;
      local_58->type = eVar5;
      eVar3 = add_to_list((_internal_exr_context *)ctxt,local_38,local_58,pcVar8);
      if (eVar3 == 0) {
        *local_40 = peVar1;
        check_attr_handler((_internal_exr_context *)ctxt,peVar1);
        goto LAB_0010d7d0;
      }
    }
LAB_0010d7b0:
    if (data_ptr != (uint8_t **)0x0) {
      *data_ptr = (uint8_t *)0x0;
    }
  }
  else {
    if (-1 < eVar3) {
      return eVar3;
    }
    peVar1 = *attr;
    iVar4 = strcmp(type,peVar1->type_name);
    if (iVar4 != 0) {
      *attr = (exr_attribute_t *)0x0;
      eVar3 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,
                         "Entry \'%s\' already in list but with different type (\'%s\' vs requested \'%s\')"
                         ,name,peVar1->type_name,type);
      return eVar3;
    }
LAB_0010d7d0:
    eVar3 = 0;
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_list_add_by_type (
    exr_context_t         ctxt,
    exr_attribute_list_t* list,
    const char*           name,
    const char*           type,
    int32_t               data_len,
    uint8_t**             data_ptr,
    exr_attribute_t**     attr)
{
    const struct _internal_exr_attr_map* known = NULL;

    exr_result_t     rval = EXR_ERR_INVALID_ARGUMENT;
    int32_t          nlen, tlen, mlen;
    size_t           slen;
    exr_attribute_t* nattr = NULL;

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!type || type[0] == '\0')
    {
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid type to add_by_type");
    }

    rval =
        validate_attr_arguments (pctxt, list, name, data_len, data_ptr, attr);
    if (rval != EXR_ERR_SUCCESS)
    {
        if (rval < 0)
        {
            if (0 != strcmp (type, (*attr)->type_name))
            {
                nattr = *attr;
                *attr = NULL;
                return pctxt->print_error (
                    pctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Entry '%s' already in list but with different type ('%s' vs requested '%s')",
                    name,
                    nattr->type_name,
                    type);
            }
            return EXR_ERR_SUCCESS;
        }
        return rval;
    }

    slen = strlen (name);
    mlen = (int32_t) pctxt->max_name_length;

    if (slen > (size_t) mlen)
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided name '%s' too long for file (len %d, max %d)",
            name,
            (int) slen,
            mlen);
    }
    nlen = (int32_t) slen;

    slen = strlen (type);
    if (slen > (size_t) mlen)
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided type name '%s' too long for file (len %d, max %d)",
            type,
            (int) slen,
            mlen);
    }
    tlen = (int32_t) slen;

    for (int i = 0; i < the_predefined_attr_count; ++i)
    {
        if (0 == strcmp (type, the_predefined_attr_typenames[i].name))
        {
            known = &(the_predefined_attr_typenames[i]);
            break;
        }
    }

    if (known)
    {
        rval = create_attr_block (
            pctxt,
            &nattr,
            known->exp_size,
            data_len,
            data_ptr,
            name,
            nlen,
            NULL,
            0);

        if (rval == EXR_ERR_SUCCESS)
        {
            nattr->type_name        = known->name;
            nattr->type_name_length = (uint8_t) known->name_len;
            nattr->type             = known->type;
        }
    }
    else
    {
        rval = create_attr_block (
            pctxt,
            &nattr,
            sizeof (exr_attr_opaquedata_t),
            data_len,
            data_ptr,
            name,
            nlen,
            type,
            tlen);

        if (rval == EXR_ERR_SUCCESS) nattr->type = EXR_ATTR_OPAQUE;
    }
    if (rval == EXR_ERR_SUCCESS) rval = add_to_list (pctxt, list, nattr, name);
    if (rval == EXR_ERR_SUCCESS)
    {
        *attr = nattr;
        check_attr_handler (pctxt, nattr);
    }
    else if (data_ptr)
        *data_ptr = NULL;

    return rval;
}